

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

void __thiscall pstack::Context::~Context(Context *this)

{
  ostream *poVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  
  if (1 < this->verbose) {
    poVar1 = this->debug;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image cache: lookups: ",0x16);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dwarfLookups);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", hits=",7);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dwarfHits);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ELF image cache: lookups: ",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,elfLookups);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", hits=",7);
    plVar2 = (long *)std::ostream::operator<<(poVar1,elfHits);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    for (p_Var3 = (this->elfCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->elfCache)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      poVar1 = this->debug;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      (**(code **)(**(long **)(*(long *)(p_Var3 + 2) + 0x40) + 0x28))
                (*(long **)(*(long *)(p_Var3 + 2) + 0x40),poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->pathReplacements);
  (this->debuginfod)._M_t.super___uniq_ptr_impl<debuginfod_client,_pstack::Context::DidClose>._M_t.
  super__Tuple_impl<0UL,_debuginfod_client_*,_pstack::Context::DidClose>.
  super__Head_base<0UL,_debuginfod_client_*,_false>._M_head_impl = (debuginfod_client *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->debugDirectories);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
  ::~_Rb_tree(&(this->elfCache)._M_t);
  std::
  _Rb_tree<std::shared_ptr<pstack::Elf::Object>,_std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<pstack::Elf::Object>,_std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
               *)this);
  return;
}

Assistant:

Context::~Context() noexcept {
    if (verbose >= 2) {
        *debug << "image cache: lookups: " << dwarfLookups << ", hits=" << dwarfHits << "\n"
               << "ELF image cache: lookups: " << elfLookups << ", hits=" << elfHits << std::endl;
        for (const auto &[name, elf] : elfCache) {
            *debug << "\t" << *elf->io << std::endl;
        }
    }
}